

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

range_lock * __thiscall pstore::file::range_lock::operator=(range_lock *this,range_lock *other)

{
  file_base *pfVar1;
  
  if (other != this) {
    if ((this->locked_ == true) && (pfVar1 = this->file_, pfVar1 != (file_base *)0x0)) {
      (*pfVar1->_vptr_file_base[0xc])(pfVar1,this->offset_,this->size_);
    }
    this->locked_ = false;
    this->file_ = other->file_;
    this->offset_ = other->offset_;
    this->size_ = other->size_;
    this->kind_ = other->kind_;
    this->locked_ = other->locked_;
    other->file_ = (file_base *)0x0;
    other->locked_ = false;
  }
  return this;
}

Assistant:

range_lock & range_lock::operator= (range_lock && other) noexcept {
            if (&other != this) {
                no_ex_escape ([this] () { this->unlock (); });
                file_ = other.file_;
                offset_ = other.offset_;
                size_ = other.size_;
                kind_ = other.kind_;
                locked_ = other.locked_;

                other.file_ = nullptr;
                other.locked_ = false;
            }
            return *this;
        }